

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_relaxng(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing relaxng : 14 of 25 functions ...\n");
  }
  iVar1 = test_xmlRelaxNGDump();
  iVar2 = test_xmlRelaxNGDumpTree();
  iVar3 = test_xmlRelaxNGGetParserErrors();
  iVar4 = test_xmlRelaxNGGetValidErrors();
  iVar5 = test_xmlRelaxNGInitTypes();
  iVar6 = test_xmlRelaxNGNewDocParserCtxt();
  iVar7 = test_xmlRelaxNGNewMemParserCtxt();
  iVar8 = test_xmlRelaxNGNewParserCtxt();
  iVar9 = test_xmlRelaxNGNewValidCtxt();
  iVar10 = test_xmlRelaxNGParse();
  iVar11 = test_xmlRelaxNGSetParserErrors();
  iVar12 = test_xmlRelaxNGSetParserStructuredErrors();
  iVar13 = test_xmlRelaxNGSetResourceLoader();
  iVar14 = test_xmlRelaxNGSetValidErrors();
  iVar15 = test_xmlRelaxNGSetValidStructuredErrors();
  iVar16 = test_xmlRelaxNGValidateDoc();
  iVar17 = test_xmlRelaxNGValidateFullElement();
  iVar18 = test_xmlRelaxNGValidatePopElement();
  iVar19 = test_xmlRelaxNGValidatePushCData();
  iVar20 = test_xmlRelaxNGValidatePushElement();
  iVar21 = test_xmlRelaxParserSetFlag();
  uVar22 = iVar21 + iVar20 + iVar19 + iVar18 + iVar17 + iVar16 + iVar15 + iVar14 + iVar13 + iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar22 != 0) {
    printf("Module relaxng: %d errors\n",(ulong)uVar22);
  }
  return uVar22;
}

Assistant:

static int
test_relaxng(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing relaxng : 14 of 25 functions ...\n");
    test_ret += test_xmlRelaxNGDump();
    test_ret += test_xmlRelaxNGDumpTree();
    test_ret += test_xmlRelaxNGGetParserErrors();
    test_ret += test_xmlRelaxNGGetValidErrors();
    test_ret += test_xmlRelaxNGInitTypes();
    test_ret += test_xmlRelaxNGNewDocParserCtxt();
    test_ret += test_xmlRelaxNGNewMemParserCtxt();
    test_ret += test_xmlRelaxNGNewParserCtxt();
    test_ret += test_xmlRelaxNGNewValidCtxt();
    test_ret += test_xmlRelaxNGParse();
    test_ret += test_xmlRelaxNGSetParserErrors();
    test_ret += test_xmlRelaxNGSetParserStructuredErrors();
    test_ret += test_xmlRelaxNGSetResourceLoader();
    test_ret += test_xmlRelaxNGSetValidErrors();
    test_ret += test_xmlRelaxNGSetValidStructuredErrors();
    test_ret += test_xmlRelaxNGValidateDoc();
    test_ret += test_xmlRelaxNGValidateFullElement();
    test_ret += test_xmlRelaxNGValidatePopElement();
    test_ret += test_xmlRelaxNGValidatePushCData();
    test_ret += test_xmlRelaxNGValidatePushElement();
    test_ret += test_xmlRelaxParserSetFlag();

    if (test_ret != 0)
	printf("Module relaxng: %d errors\n", test_ret);
    return(test_ret);
}